

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::completerActivated(QComboBoxPrivate *this,QModelIndex *index)

{
  QComboBox *this_00;
  bool bVar1;
  MatchFlags flags;
  int iVar2;
  QCompleter *pQVar3;
  QAbstractItemModel *pQVar4;
  QAbstractProxyModel *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  int local_68 [4];
  QAbstractItemModel *local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && (pQVar3 = QComboBox::completer(this_00), pQVar3 != (QCompleter *)0x0)) {
    pQVar3 = QComboBox::completer(this_00);
    pQVar4 = QCompleter::completionModel(pQVar3);
    pQVar5 = QtPrivate::qobject_cast_helper<QAbstractProxyModel*,QObject>((QObject *)pQVar4);
    if (pQVar5 != (QAbstractProxyModel *)0x0) {
      (**(code **)(*(long *)pQVar5 + 400))(local_68,pQVar5,index);
      if (local_58 != this->model) {
        pQVar3 = QComboBox::completer(this_00);
        pQVar4 = QCompleter::model(pQVar3);
        pQVar5 = QtPrivate::qobject_cast_helper<QAbstractProxyModel*,QObject>((QObject *)pQVar4);
        if ((pQVar5 == (QAbstractProxyModel *)0x0) ||
           (pQVar4 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel(), pQVar4 != this->model
           )) {
          local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar3 = QComboBox::completer(this_00);
          pQVar4 = QCompleter::model(pQVar3);
          (**(code **)(*(long *)pQVar4 + 0x90))(&local_50,pQVar4,local_68,0);
          ::QVariant::toString();
          ::QVariant::~QVariant((QVariant *)&local_50);
          flags = matchFlags(this);
          iVar2 = QComboBox::findText(this_00,(QString *)&local_88,flags);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          local_68[0] = iVar2;
        }
        else {
          (**(code **)(*(long *)pQVar5 + 400))(&local_50,pQVar5,local_68);
          local_68[0] = local_50._0_4_;
        }
      }
      QComboBox::setCurrentIndex(this_00,local_68[0]);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_50,&this->currentIndex);
      emitActivated(this,(QModelIndex *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::completerActivated(const QModelIndex &index)
{
    Q_Q(QComboBox);
#if QT_CONFIG(proxymodel)
    if (index.isValid() && q->completer()) {
        QAbstractProxyModel *proxy = qobject_cast<QAbstractProxyModel *>(q->completer()->completionModel());
        if (proxy) {
            const QModelIndex &completerIndex = proxy->mapToSource(index);
            int row = -1;
            if (completerIndex.model() == model) {
                row = completerIndex.row();
            } else {
                // if QCompleter uses a proxy model to host widget's one - map again
                QAbstractProxyModel *completerProxy = qobject_cast<QAbstractProxyModel *>(q->completer()->model());
                if (completerProxy && completerProxy->sourceModel() == model) {
                    row = completerProxy->mapToSource(completerIndex).row();
                } else {
                    QString match = q->completer()->model()->data(completerIndex).toString();
                    row = q->findText(match, matchFlags());
                }
            }
            q->setCurrentIndex(row);
            emitActivated(currentIndex);
        }
    }
#endif
}